

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

World * __thiscall
MyPlanner::InitializeWorld(MyPlanner *this,string *world_type,DSPOMDP *model,Option *options)

{
  POMDPX *pPVar1;
  World *pWVar2;
  allocator<char> local_49;
  long *local_48 [2];
  long local_38 [2];
  
  if (*(long *)(options + 0xa0) != 0) {
    pPVar1 = (POMDPX *)operator_new(0x118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,*(char **)(options + 0xb0),&local_49);
    despot::POMDPX::POMDPX(pPVar1,local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    despot::POMDPX::current_ = pPVar1;
    pWVar2 = (World *)despot::PlannerBase::InitializePOMDPWorld
                                ((string *)this,(DSPOMDP *)world_type,(Option *)(pPVar1 + 0x38));
    return pWVar2;
  }
  pWVar2 = (World *)despot::PlannerBase::InitializePOMDPWorld
                              ((string *)this,(DSPOMDP *)world_type,(Option *)model);
  return pWVar2;
}

Assistant:

World* InitializeWorld(std::string&  world_type, DSPOMDP* model, option::Option* options)
  {
		if (options[E_WORLD_FILE]) { // ignore the provided model
			DSPOMDP* world = new POMDPX(options[E_WORLD_FILE].arg);
			POMDPX::current_ = (POMDPX*) world;

			return InitializePOMDPWorld(world_type, world, options);
		} else {
			return InitializePOMDPWorld(world_type, model, options);
		}
  }